

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O1

FT_UInt bdf_cmap_char_index(FT_CMap bdfcmap,FT_UInt32 charcode)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  FT_Face pFVar4;
  uint uVar5;
  FT_Face pFVar6;
  FT_Face pFVar7;
  
  lVar1 = *(long *)&bdfcmap[1].charmap.encoding;
  uVar3 = (ulong)charcode;
  uVar5 = 0;
  pFVar6 = (FT_Face)0x0;
  pFVar4 = bdfcmap[1].charmap.face;
  do {
    if (pFVar4 <= pFVar6) break;
    pFVar7 = (FT_Face)((ulong)((long)&pFVar4->num_faces + (long)&pFVar6->num_faces) >> 1);
    uVar2 = *(ulong *)(lVar1 + (long)pFVar7 * 0x10);
    if (uVar2 == uVar3) {
      uVar5 = *(int *)((long)pFVar7 * 0x10 + lVar1 + 8) + 1;
      pFVar7 = pFVar4;
    }
    else if (uVar2 <= uVar3) {
      pFVar6 = (FT_Face)((long)&pFVar7->num_faces + 1);
      pFVar7 = pFVar4;
    }
    pFVar4 = pFVar7;
  } while (uVar2 != uVar3);
  return uVar5 & 0xffff;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  bdf_cmap_char_index( FT_CMap    bdfcmap,
                       FT_UInt32  charcode )
  {
    BDF_CMap          cmap      = (BDF_CMap)bdfcmap;
    BDF_encoding_el*  encodings = cmap->encodings;
    FT_ULong          min, max, mid; /* num_encodings */
    FT_UShort         result    = 0; /* encodings->glyph */


    min = 0;
    max = cmap->num_encodings;

    while ( min < max )
    {
      FT_ULong  code;


      mid  = ( min + max ) >> 1;
      code = (FT_ULong)encodings[mid].enc;

      if ( charcode == code )
      {
        /* increase glyph index by 1 --              */
        /* we reserve slot 0 for the undefined glyph */
        result = encodings[mid].glyph + 1;
        break;
      }

      if ( charcode < code )
        max = mid;
      else
        min = mid + 1;
    }

    return result;
  }